

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.cpp
# Opt level: O0

Variant * __thiscall
Jinx::Impl::Script::CallFunction(Variant *__return_storage_ptr__,Script *this,RuntimeID id)

{
  bool bVar1;
  element_type *id_00;
  element_type *peVar2;
  __shared_ptr *this_00;
  FunctionCallback local_68;
  byte local_41;
  undefined4 local_40;
  bool finished;
  undefined1 local_30 [8];
  FunctionDefinitionPtr functionDef;
  RuntimeID id_local;
  Script *this_local;
  
  functionDef.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)id;
  id_00 = std::__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&this->m_runtime);
  Runtime::FindFunction((Runtime *)local_30,(RuntimeID)id_00);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    this_00 = (__shared_ptr *)FunctionDefinition::GetBytecode(peVar2);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (bVar1) {
      CallBytecodeFunction(this,(FunctionDefinitionPtr *)local_30,Wait);
      local_41 = this->m_finished & 1;
      this->m_finished = false;
      bVar1 = Execute(this);
      if (bVar1) {
        this->m_finished = (bool)(local_41 & 1);
        Pop(__return_storage_ptr__,this);
      }
      else {
        Variant::Variant(__return_storage_ptr__,(nullptr_t)0x0);
      }
    }
    else {
      peVar2 = std::
               __shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      FunctionDefinition::GetCallback(&local_68,peVar2);
      bVar1 = std::function::operator_cast_to_bool((function *)&local_68);
      std::
      function<Jinx::Variant_(std::shared_ptr<Jinx::IScript>,_const_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_&)>
      ::~function(&local_68);
      if (bVar1) {
        CallNativeFunction(__return_storage_ptr__,this,(FunctionDefinitionPtr *)local_30);
      }
      else {
        Error(this,"Error in function definition");
        Variant::Variant(__return_storage_ptr__,(nullptr_t)0x0);
      }
    }
  }
  else {
    Error(this,"Could not find function definition");
    Variant::Variant(__return_storage_ptr__,false);
  }
  local_40 = 1;
  std::shared_ptr<Jinx::Impl::FunctionDefinition>::~shared_ptr
            ((shared_ptr<Jinx::Impl::FunctionDefinition> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant Script::CallFunction(RuntimeID id)
	{
		FunctionDefinitionPtr functionDef = m_runtime->FindFunction(id);
		if (!functionDef)
		{
			Error("Could not find function definition");
			return false;
		}
		// Check to see if this is a bytecode function
		if (functionDef->GetBytecode())
		{
			CallBytecodeFunction(functionDef, OnReturn::Wait);
			bool finished = m_finished;
			m_finished = false;
			if (!Execute())
				return nullptr;
			m_finished = finished;
			return Pop();
		}
		// Otherwise, call a native function callback
		else if (functionDef->GetCallback())
		{
			return CallNativeFunction(functionDef);
		}
		else
		{
			Error("Error in function definition");
		}
		return nullptr;
	}